

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_screenWindowCenter
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  int iVar1;
  exr_result_t eVar2;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_attr_v2f_t tmpdata;
  exr_result_t rv;
  undefined8 local_38;
  int local_30;
  int local_2c;
  char *local_28;
  long local_20;
  long local_18;
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = strcmp(in_RCX,"v2f");
  if (iVar1 == 0) {
    if (local_2c == 8) {
      local_30 = (**(code **)(local_20 + 0x20))(local_20,&local_38,8);
      if (local_30 == 0) {
        priv_to_native32(&local_38,2);
        if (*(long *)(local_18 + 0x50) == 0) {
          local_30 = exr_attr_list_add_static_name
                               ((exr_context_t)CONCAT44(attrsz,rv),(exr_attribute_list_t *)tmpdata,
                                in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                (uint8_t **)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (exr_attribute_t **)curpart);
          if (local_30 == 0) {
            **(undefined8 **)(*(long *)(local_18 + 0x50) + 0x18) = local_38;
            eVar2 = 0;
          }
          else {
            eVar2 = (**(code **)(local_10 + 0x48))
                              (local_10,local_30,
                               "Unable to initialize attribute \'%s\', type \'v2f\'",
                               "screenWindowCenter");
          }
        }
        else if (*(char *)(local_10 + 6) == '\0') {
          **(undefined8 **)(*(long *)(local_18 + 0x50) + 0x18) = local_38;
          eVar2 = 0;
        }
        else {
          eVar2 = (**(code **)(local_10 + 0x48))
                            (local_10,0xe,"Duplicate copy of required attribute \'%s\' encountered",
                             "screenWindowCenter");
        }
      }
      else {
        eVar2 = (**(code **)(local_10 + 0x48))
                          (local_10,local_30,"Attribute \'%s\': Unable to read data (%d bytes)",
                           "screenWindowCenter",local_2c);
      }
    }
    else {
      (**(code **)(local_20 + 0x28))(local_20,local_2c);
      eVar2 = (**(code **)(local_10 + 0x48))
                        (local_10,0x11,"Required attribute \'%s\': Invalid size %d (exp %lu)",
                         "screenWindowCenter",local_2c,8);
    }
  }
  else {
    (**(code **)(local_20 + 0x28))(local_20,local_2c);
    eVar2 = (**(code **)(local_10 + 0x48))
                      (local_10,0x10,"Required attribute \'%s\': Invalid type \'%s\'",
                       "screenWindowCenter",local_28);
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_screenWindowCenter (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t   rv;
    exr_attr_v2f_t tmpdata;

    if (0 != strcmp (tname, "v2f"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute '%s': Invalid type '%s'",
            EXR_REQ_SCR_WC_STR,
            tname);
    }

    if (attrsz != sizeof (exr_attr_v2f_t))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Required attribute '%s': Invalid size %d (exp %" PRIu64 ")",
            EXR_REQ_SCR_WC_STR,
            attrsz,
            (uint64_t) sizeof (exr_attr_v2f_t));
    }

    rv = scratch->sequential_read (scratch, &tmpdata, sizeof (exr_attr_v2f_t));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Attribute '%s': Unable to read data (%d bytes)",
            EXR_REQ_SCR_WC_STR,
            attrsz);

    priv_to_native32 (&tmpdata, 2);

    if (curpart->screenWindowCenter)
    {
        if (ctxt->strict_header)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Duplicate copy of required attribute '%s' encountered",
                EXR_REQ_SCR_WC_STR);
        }

        /* legacy code allowed attributes to just overwrite, preserve
         * that behavior (barring other failure)
         */
        *(curpart->screenWindowCenter->v2f) = tmpdata;
        return EXR_ERR_SUCCESS;
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_SCR_WC_STR,
        EXR_ATTR_V2F,
        0,
        NULL,
        &(curpart->screenWindowCenter));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'v2f'",
            EXR_REQ_SCR_WC_STR);

    *(curpart->screenWindowCenter->v2f) = tmpdata;
    return rv;
}